

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

bool __thiscall
TimesAll<0,_0,_0>::propagate_z
          (TimesAll<0,_0,_0> *this,int64_t x_min,int64_t x_max,int64_t y_min,int64_t y_max)

{
  bool bVar1;
  Lit LVar2;
  long *plVar3;
  Lit *pLVar4;
  uint64_t *puVar5;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  IntView<0> *in_RDI;
  long in_R8;
  Reason m_r_1;
  int64_t m_v_1;
  Clause *reason_1;
  int64_t z_max_new;
  Reason m_r;
  int64_t m_v;
  Clause *reason;
  int64_t z_min_new;
  int64_t prod_max_max;
  int64_t prod_max_min;
  int64_t prod_min_max;
  int64_t prod_min_min;
  undefined1 channel;
  IntView<0> *in_stack_ffffffffffffff40;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff48;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff50;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  Clause *local_98;
  anon_union_8_2_743a5d44_for_Reason_0 local_90;
  anon_union_8_2_743a5d44_for_Reason_0 local_88;
  anon_union_8_2_743a5d44_for_Reason_0 local_80;
  long local_78;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  Clause *local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38 [7];
  
  local_38[0] = in_RSI * in_RCX;
  local_40 = in_RSI * in_R8;
  local_48 = in_RDX * in_RCX;
  local_50 = in_RDX * in_R8;
  plVar3 = std::min<long>(local_38,&local_40);
  local_58 = *plVar3;
  plVar3 = std::min<long>(&local_58,&local_48);
  local_58 = *plVar3;
  plVar3 = std::min<long>(&local_58,&local_50);
  local_58 = *plVar3;
  if (-500000000 < local_58) {
    local_60 = (Clause *)0x0;
    if ((so.lazy & 1U) != 0) {
      local_60 = ::Reason_new((int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      local_64 = (int)IntView<0>::getMinLit(in_RDI);
      pLVar4 = Clause::operator[]((Clause *)in_stack_ffffffffffffff40,(int)((ulong)in_RDI >> 0x20));
      pLVar4->x = local_64;
      local_68 = (int)IntView<0>::getMaxLit(in_RDI);
      pLVar4 = Clause::operator[]((Clause *)in_stack_ffffffffffffff40,(int)((ulong)in_RDI >> 0x20));
      pLVar4->x = local_68;
      local_6c = (int)IntView<0>::getMinLit(in_RDI);
      pLVar4 = Clause::operator[]((Clause *)in_stack_ffffffffffffff40,(int)((ulong)in_RDI >> 0x20));
      pLVar4->x = local_6c;
      local_70 = (int)IntView<0>::getMaxLit(in_RDI);
      pLVar4 = Clause::operator[]((Clause *)in_stack_ffffffffffffff40,(int)((ulong)in_RDI >> 0x20));
      pLVar4->x = local_70;
    }
    local_78 = local_58;
    bVar1 = IntView<0>::setMinNotR(in_stack_ffffffffffffff40,(int64_t)in_RDI);
    if (bVar1) {
      Reason::Reason((Reason *)&local_80,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        Reason::Reason((Reason *)&local_80,local_60);
      }
      local_88 = local_80;
      bVar1 = IntView<0>::setMin((IntView<0> *)in_stack_ffffffffffffff48._pt,
                                 (int64_t)in_stack_ffffffffffffff40,
                                 (Reason)in_stack_ffffffffffffff50,SUB81((ulong)in_RDI >> 0x38,0));
      if (!bVar1) {
        return false;
      }
    }
  }
  puVar5 = (uint64_t *)std::max<long>(local_38,&local_40);
  local_90._a = *puVar5;
  puVar5 = (uint64_t *)std::max<long>((long *)&local_90._a,&local_48);
  local_90._a = *puVar5;
  puVar5 = (uint64_t *)std::max<long>((long *)&local_90._a,&local_50);
  local_90._a = *puVar5;
  if ((long)local_90._pt < 500000000) {
    local_98 = (Clause *)0x0;
    if ((so.lazy & 1U) != 0) {
      local_98 = ::Reason_new((int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      LVar2 = IntView<0>::getMinLit(in_RDI);
      pLVar4 = Clause::operator[]((Clause *)in_stack_ffffffffffffff40,(int)((ulong)in_RDI >> 0x20));
      pLVar4->x = LVar2.x;
      LVar2 = IntView<0>::getMaxLit(in_RDI);
      pLVar4 = Clause::operator[]((Clause *)in_stack_ffffffffffffff40,(int)((ulong)in_RDI >> 0x20));
      pLVar4->x = LVar2.x;
      LVar2 = IntView<0>::getMinLit(in_RDI);
      pLVar4 = Clause::operator[]((Clause *)in_stack_ffffffffffffff40,(int)((ulong)in_RDI >> 0x20));
      pLVar4->x = LVar2.x;
      LVar2 = IntView<0>::getMaxLit(in_RDI);
      pLVar4 = Clause::operator[]((Clause *)in_stack_ffffffffffffff40,(int)((ulong)in_RDI >> 0x20));
      pLVar4->x = LVar2.x;
    }
    r = local_90;
    bVar1 = IntView<0>::setMaxNotR(in_stack_ffffffffffffff40,(int64_t)in_RDI);
    channel = (undefined1)((ulong)in_RDI >> 0x38);
    if (bVar1) {
      Reason::Reason((Reason *)&stack0xffffffffffffff48,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        Reason::Reason((Reason *)&stack0xffffffffffffff48,local_98);
      }
      bVar1 = IntView<0>::setMax((IntView<0> *)in_stack_ffffffffffffff48._pt,
                                 (int64_t)in_stack_ffffffffffffff48,(Reason)r,(bool)channel);
      if (!bVar1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool propagate_z(const int64_t x_min, const int64_t x_max, const int64_t y_min,
									 const int64_t y_max) {
		// Computing all possible extreme points of x * y
		const int64_t prod_min_min = x_min * y_min;
		const int64_t prod_min_max = x_min * y_max;
		const int64_t prod_max_min = x_max * y_min;
		const int64_t prod_max_max = x_max * y_max;

		// New lower bound on z
		int64_t z_min_new = std::min(prod_min_min, prod_min_max);
		z_min_new = std::min(z_min_new, prod_max_min);
		z_min_new = std::min(z_min_new, prod_max_max);

		if (z_min_new > IntVar::min_limit) {
			// TODO Better explanation
			Clause* reason = nullptr;
			if (so.lazy) {
				reason = Reason_new(5);
				(*reason)[1] = x.getMinLit();
				(*reason)[2] = x.getMaxLit();
				(*reason)[3] = y.getMinLit();
				(*reason)[4] = y.getMaxLit();
			}
			setDom(z, setMin, z_min_new, reason);
		}

		// New upper bound on z
		int64_t z_max_new = std::max(prod_min_min, prod_min_max);
		z_max_new = std::max(z_max_new, prod_max_min);
		z_max_new = std::max(z_max_new, prod_max_max);

		if (z_max_new < IntVar::max_limit) {
			// TODO Better explanation
			Clause* reason = nullptr;
			if (so.lazy) {
				reason = Reason_new(5);
				(*reason)[1] = x.getMinLit();
				(*reason)[2] = x.getMaxLit();
				(*reason)[3] = y.getMinLit();
				(*reason)[4] = y.getMaxLit();
			}
			setDom(z, setMax, z_max_new, reason);
		}

		return true;
	}